

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nap_communicate.hpp
# Opt level: O3

void MPIX_step_recv(comm_pkg *comm,int tag,MPI_Comm mpi_comm,MPI_Datatype mpi_type,
                   MPI_Request *recv_requests,char **recv_buffer_ptr)

{
  long lVar1;
  int iVar2;
  long lVar3;
  comm_data *pcVar4;
  int iVar5;
  int size;
  int local_50;
  int local_4c;
  char *local_48;
  char **local_40;
  comm_pkg *local_38;
  
  pcVar4 = comm->recv_data;
  local_40 = recv_buffer_ptr;
  if (pcVar4->size_msgs == 0) {
    local_48 = (char *)0x0;
  }
  else {
    MPI_Pack_size(pcVar4->size_msgs,mpi_type,mpi_comm,&local_50);
    iVar5 = -1;
    if (-1 < local_50) {
      iVar5 = local_50;
    }
    local_48 = (char *)operator_new__((long)iVar5);
    pcVar4 = comm->recv_data;
  }
  if (0 < pcVar4->num_msgs) {
    iVar5 = 0;
    lVar3 = 0;
    local_4c = tag;
    local_38 = comm;
    do {
      iVar2 = pcVar4->procs[lVar3];
      lVar1 = lVar3 + 1;
      MPI_Pack_size(pcVar4->indptr[lVar3 + 1] - pcVar4->indptr[lVar3],mpi_type,mpi_comm,&local_50);
      MPI_Irecv(local_48 + iVar5,local_50,&ompi_mpi_packed,iVar2,local_4c,mpi_comm,recv_requests);
      iVar5 = iVar5 + local_50;
      pcVar4 = local_38->recv_data;
      recv_requests = recv_requests + 1;
      lVar3 = lVar1;
    } while (lVar1 < pcVar4->num_msgs);
  }
  if (local_48 != (char *)0x0) {
    *local_40 = local_48;
  }
  return;
}

Assistant:

static void MPIX_step_recv(comm_pkg* comm,
        int tag, MPI_Comm mpi_comm, MPI_Datatype mpi_type,
        MPI_Request* recv_requests, char** recv_buffer_ptr)
{
    int proc, start, end, size;
    char* recv_buffer = NULL;
    if (comm->recv_data->size_msgs)
    {
        MPI_Pack_size(comm->recv_data->size_msgs, mpi_type, mpi_comm, &size);
        recv_buffer = new char[size];
    }

    int ctr = 0;
    for (int i = 0; i < comm->recv_data->num_msgs; i++)
    {
        proc = comm->recv_data->procs[i];
        start = comm->recv_data->indptr[i];
        end = comm->recv_data->indptr[i+1];
        MPI_Pack_size(end - start, mpi_type, mpi_comm, &size);
        MPI_Irecv(&recv_buffer[ctr], size, MPI_PACKED, proc, tag,
                mpi_comm, &recv_requests[i]);
        ctr += size;
    }

    if (recv_buffer) *recv_buffer_ptr = recv_buffer;
}